

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

bool semver::operator==(version<int,_int,_int> *lhs,version<int,_int,_int> *rhs)

{
  int iVar1;
  
  iVar1 = detail::compare_parsed<int,int,int>(lhs,rhs,include_prerelease);
  return iVar1 == 0;
}

Assistant:

[[nodiscard]] SEMVER_CONSTEXPR bool operator==(const version<I1, I2, I3>& lhs, const version<I1, I2, I3>& rhs) noexcept {
  return detail::compare_parsed(lhs, rhs, version_compare_option::include_prerelease) == 0;
}